

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cc
# Opt level: O1

void __thiscall brotli::StartPosQueue::Push(StartPosQueue *this,size_t pos,double costdiff)

{
  double dVar1;
  double dVar2;
  pointer ppVar3;
  unsigned_long uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  pointer ppVar8;
  ulong uVar9;
  pointer ppVar10;
  
  if (costdiff < INFINITY) {
    ppVar3 = (this->q_).
             super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar5 = -this->idx_ & this->mask_;
    uVar9 = this->idx_ + 1;
    this->idx_ = uVar9;
    uVar6 = this->mask_ + 1;
    if (uVar9 <= uVar6) {
      uVar6 = uVar9;
    }
    ppVar3[uVar5].first = pos;
    ppVar3[uVar5].second = costdiff;
    if (1 < uVar6) {
      lVar7 = uVar6 - 1;
      do {
        uVar9 = this->mask_ & uVar5;
        dVar1 = ppVar3[uVar9].second;
        uVar5 = uVar5 + 1;
        uVar6 = this->mask_ & uVar5;
        dVar2 = ppVar3[uVar6].second;
        if (dVar2 < dVar1) {
          ppVar10 = ppVar3 + uVar9;
          ppVar8 = ppVar3 + uVar6;
          uVar4 = ppVar10->first;
          ppVar10->first = ppVar8->first;
          ppVar8->first = uVar4;
          ppVar10->second = dVar2;
          ppVar8->second = dVar1;
        }
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
  }
  return;
}

Assistant:

void Push(size_t pos, double costdiff) {
    if (costdiff == kInfinity) {
      // We can't start a command from an unreachable start position.
      // E.g. position 1 in a stream is always unreachable, because all commands
      // have a copy of at least length 2.
      return;
    }
    size_t offset = -idx_ & mask_;
    ++idx_;
    size_t len = size();
    q_[offset] = std::make_pair(pos, costdiff);
    /* Restore the sorted order. In the list of |len| items at most |len - 1|
       adjacent element comparisons / swaps are required. */
    for (size_t i = 1; i < len; ++i) {
      if (q_[offset & mask_].second > q_[(offset + 1) & mask_].second) {
        std::swap(q_[offset & mask_], q_[(offset + 1) & mask_]);
      }
      ++offset;
    }
  }